

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int source_get_distribution_mode(SOURCE_HANDLE source,char **distribution_mode_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  
  if (source == (SOURCE_HANDLE)0x0) {
    iVar3 = 0x3275;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(source->composite_value,&item_count);
    iVar3 = 0x327d;
    if ((iVar1 == 0) && (iVar3 = 0x3283, 6 < item_count)) {
      value = amqpvalue_get_composite_item_in_place(source->composite_value,6);
      iVar3 = 0x328b;
      if ((value != (AMQP_VALUE)0x0) && (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)
         ) {
        iVar1 = amqpvalue_get_symbol(value,distribution_mode_value);
        iVar3 = 0x3292;
        if (iVar1 == 0) {
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int source_get_distribution_mode(SOURCE_HANDLE source, const char** distribution_mode_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        if (amqpvalue_get_composite_item_count(source_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 6)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(source_instance->composite_value, 6);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_symbol(item_value, distribution_mode_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}